

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

void __thiscall PClassActor::PClassActor(PClassActor *this)

{
  PClassActor *local_28 [3];
  PClassActor *local_10;
  PClassActor *this_local;
  
  local_10 = this;
  PClass::PClass(&this->super_PClass);
  (this->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_00b6c250;
  TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::TArray(&this->VisibleToPlayerClass);
  FString::FString(&this->Obituary);
  FString::FString(&this->HitObituary);
  PalEntry::PalEntry(&this->BloodColor);
  FSoundID::FSoundID(&this->HowlSound);
  FName::FName(&this->BloodType);
  FName::FName(&this->BloodType2);
  FName::FName(&this->BloodType3);
  FString::FString(&this->SourceLumpName);
  FSoundID::FSoundID(&this->MeleeSound);
  FName::FName(&this->MissileName);
  this->GameFilter = '\0';
  this->SpawnID = 0;
  this->DoomEdNum = -1;
  this->OwnedStates = (FState *)0x0;
  this->NumOwnedStates = 0;
  this->Replacement = (PClassActor *)0x0;
  this->Replacee = (PClassActor *)0x0;
  this->StateList = (FStateLabels *)0x0;
  this->DamageFactors = (DmgFactors *)0x0;
  this->PainChances = (PainChanceList *)0x0;
  this->DeathHeight = -1.0;
  this->BurnHeight = -1.0;
  this->GibHealth = -0x80000000;
  this->WoundHealth = 6;
  this->PoisonDamage = 0;
  this->FastSpeed = -1.0;
  this->RDFactor = 1.0;
  this->CameraHeight = -2147483648.0;
  this->DropItems = (DDropItem *)0x0;
  this->DontHurtShooter = false;
  this->ExplosionRadius = -1;
  this->MeleeDamage = 0;
  local_28[0] = this;
  TArray<PClassActor_*,_PClassActor_*>::Push(&AllActorClasses,local_28);
  return;
}

Assistant:

PClassActor::PClassActor()
{
	GameFilter = GAME_Any;
	SpawnID = 0;
	DoomEdNum = -1;
	OwnedStates = NULL;
	NumOwnedStates = 0;
	Replacement = NULL;
	Replacee = NULL;
	StateList = NULL;
	DamageFactors = NULL;
	PainChances = NULL;

	DeathHeight = -1;
	BurnHeight = -1;
	GibHealth = INT_MIN;
	WoundHealth = 6;
	PoisonDamage = 0;
	FastSpeed = -1.;
	RDFactor = 1.;
	CameraHeight = INT_MIN;

	DropItems = NULL;

	DontHurtShooter = false;
	ExplosionRadius = -1;
	MeleeDamage = 0;

	// Record this in the master list.
	AllActorClasses.Push(this);
}